

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_both.cc
# Opt level: O0

int bssl::send_ack(SSL *ssl)

{
  bool bVar1;
  uint16_t uVar2;
  int iVar3;
  unsigned_long *puVar4;
  size_t sVar5;
  DTLSRecordNumber *pDVar6;
  DTLSRecordNumber *__last;
  uint64_t value;
  uint8_t *puVar7;
  size_t sVar8;
  BIO *b;
  pointer bio;
  size_t sVar9;
  Span<const_unsigned_char> in;
  undefined1 auStack_660 [4];
  int bio_ret;
  uchar *local_658;
  undefined4 local_64c;
  DTLSRecordNumber local_648;
  DTLSRecordNumber record_number;
  size_t record_len;
  uint8_t record [584];
  DTLSRecordNumber *number;
  DTLSRecordNumber *__end1;
  DTLSRecordNumber *__begin1;
  InplaceVector<bssl::DTLSRecordNumber,_32UL> *__range1;
  CBB child;
  CBB cbb;
  uint8_t buf [514];
  size_t local_148;
  size_t i;
  InplaceVector<bssl::DTLSRecordNumber,_32UL> sorted;
  ulong local_30;
  unsigned_long local_28;
  size_t num_acks;
  size_t max_plaintext;
  SSL *ssl_local;
  
  max_plaintext = (size_t)ssl;
  uVar2 = ssl_protocol_version(ssl);
  if (uVar2 < 0x304) {
    __assert_fail("ssl_protocol_version(ssl) >= TLS1_3_VERSION",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                  ,0x3c2,"int bssl::send_ack(SSL *)");
  }
  dtls1_update_mtu((SSL *)max_plaintext);
  sVar5 = max_plaintext;
  uVar2 = DTLSWriteEpoch::epoch((DTLSWriteEpoch *)(*(long *)(max_plaintext + 0x38) + 0xa0));
  num_acks = dtls_seal_max_input_len
                       ((SSL *)sVar5,uVar2,(ulong)*(uint *)(*(long *)(max_plaintext + 0x38) + 0x3c8)
                       );
  if (num_acks < 0x12) {
    ERR_put_error(0x10,0,0xa9,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                  ,0x3ca);
    ssl_local._4_4_ = -1;
  }
  else {
    local_30 = num_acks - 2 >> 4;
    sorted._256_8_ =
         MRUQueue<bssl::DTLSRecordNumber,_32UL>::size
                   ((MRUQueue<bssl::DTLSRecordNumber,_32UL> *)
                    (*(long *)(max_plaintext + 0x38) + 0x2b0));
    puVar4 = std::min<unsigned_long>(&local_30,(unsigned_long *)&sorted.size_);
    local_28 = *puVar4;
    InplaceVector<bssl::DTLSRecordNumber,_32UL>::InplaceVector
              ((InplaceVector<bssl::DTLSRecordNumber,_32UL> *)&i);
    local_148 = MRUQueue<bssl::DTLSRecordNumber,_32UL>::size
                          ((MRUQueue<bssl::DTLSRecordNumber,_32UL> *)
                           (*(long *)(max_plaintext + 0x38) + 0x2b0));
    local_148 = local_148 - local_28;
    while( true ) {
      sVar5 = MRUQueue<bssl::DTLSRecordNumber,_32UL>::size
                        ((MRUQueue<bssl::DTLSRecordNumber,_32UL> *)
                         (*(long *)(max_plaintext + 0x38) + 0x2b0));
      if (sVar5 <= local_148) break;
      pDVar6 = MRUQueue<bssl::DTLSRecordNumber,_32UL>::operator[]
                         ((MRUQueue<bssl::DTLSRecordNumber,_32UL> *)
                          (*(long *)(max_plaintext + 0x38) + 0x2b0),local_148);
      InplaceVector<bssl::DTLSRecordNumber,_32UL>::PushBack
                ((InplaceVector<bssl::DTLSRecordNumber,_32UL> *)&i,
                 (DTLSRecordNumber)pDVar6->combined_);
      local_148 = local_148 + 1;
    }
    pDVar6 = InplaceVector<bssl::DTLSRecordNumber,_32UL>::begin
                       ((InplaceVector<bssl::DTLSRecordNumber,_32UL> *)&i);
    __last = InplaceVector<bssl::DTLSRecordNumber,_32UL>::end
                       ((InplaceVector<bssl::DTLSRecordNumber,_32UL> *)&i);
    std::sort<bssl::DTLSRecordNumber*>(pDVar6,__last);
    CBB_init_fixed((CBB *)((long)&child.u + 0x18),(uint8_t *)((long)&cbb.u + 0x18),0x202);
    iVar3 = CBB_add_u16_length_prefixed((CBB *)((long)&child.u + 0x18),(CBB *)&__range1);
    if (iVar3 == 0) {
      abort();
    }
    __end1 = InplaceVector<bssl::DTLSRecordNumber,_32UL>::begin
                       ((InplaceVector<bssl::DTLSRecordNumber,_32UL> *)&i);
    pDVar6 = InplaceVector<bssl::DTLSRecordNumber,_32UL>::end
                       ((InplaceVector<bssl::DTLSRecordNumber,_32UL> *)&i);
    for (; __end1 != pDVar6; __end1 = __end1 + 1) {
      uVar2 = DTLSRecordNumber::epoch(__end1);
      iVar3 = CBB_add_u64((CBB *)&__range1,(ulong)uVar2);
      if (iVar3 == 0) {
        abort();
      }
      value = DTLSRecordNumber::sequence(__end1);
      iVar3 = CBB_add_u64((CBB *)&__range1,value);
      if (iVar3 == 0) {
        abort();
      }
    }
    iVar3 = CBB_flush((CBB *)((long)&child.u + 0x18));
    if (iVar3 == 0) {
      abort();
    }
    DTLSRecordNumber::DTLSRecordNumber(&local_648);
    sVar5 = max_plaintext;
    puVar7 = CBB_data((CBB *)((long)&child.u + 0x18));
    sVar8 = CBB_len((CBB *)((long)&child.u + 0x18));
    uVar2 = DTLSWriteEpoch::epoch((DTLSWriteEpoch *)(*(long *)(max_plaintext + 0x38) + 0xa0));
    sVar9 = 0x1a;
    bVar1 = dtls_seal_record((SSL *)sVar5,&local_648,(uint8_t *)&record_len,&record_number.combined_
                             ,0x248,'\x1a',puVar7,sVar8,uVar2);
    sVar5 = max_plaintext;
    if (bVar1) {
      puVar7 = CBB_data((CBB *)((long)&child.u + 0x18));
      sVar8 = CBB_len((CBB *)((long)&child.u + 0x18));
      Span<const_unsigned_char>::Span((Span<const_unsigned_char> *)auStack_660,puVar7,sVar8);
      in.size_ = sVar9;
      in.data_ = local_658;
      ssl_do_msg_callback((bssl *)sVar5,(SSL *)0x1,0x1a,(int)auStack_660,in);
      b = (BIO *)std::unique_ptr<bio_st,_bssl::internal::Deleter>::get
                           ((unique_ptr<bio_st,_bssl::internal::Deleter> *)(max_plaintext + 0x20));
      ssl_local._4_4_ = BIO_write(b,&record_len,(int)record_number.combined_);
      if (ssl_local._4_4_ < 1) {
        *(undefined4 *)(*(long *)(max_plaintext + 0x30) + 0xc4) = 3;
      }
      else {
        bio = std::unique_ptr<bio_st,_bssl::internal::Deleter>::get
                        ((unique_ptr<bio_st,_bssl::internal::Deleter> *)(max_plaintext + 0x20));
        iVar3 = BIO_flush(bio);
        if (iVar3 < 1) {
          *(undefined4 *)(*(long *)(max_plaintext + 0x30) + 0xc4) = 3;
          ssl_local._4_4_ = -1;
        }
        else {
          ssl_local._4_4_ = 1;
        }
      }
    }
    else {
      ssl_local._4_4_ = -1;
    }
    local_64c = 1;
    InplaceVector<bssl::DTLSRecordNumber,_32UL>::~InplaceVector
              ((InplaceVector<bssl::DTLSRecordNumber,_32UL> *)&i);
  }
  return ssl_local._4_4_;
}

Assistant:

static int send_ack(SSL *ssl) {
  assert(ssl_protocol_version(ssl) >= TLS1_3_VERSION);

  // Ensure we don't send so many ACKs that we overflow the MTU. There is a
  // 2-byte length prefix and each ACK is 16 bytes.
  dtls1_update_mtu(ssl);
  size_t max_plaintext =
      dtls_seal_max_input_len(ssl, ssl->d1->write_epoch.epoch(), ssl->d1->mtu);
  if (max_plaintext < 2 + 16) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_MTU_TOO_SMALL);  // No room for even one ACK.
    return -1;
  }
  size_t num_acks =
      std::min((max_plaintext - 2) / 16, ssl->d1->records_to_ack.size());

  // Assemble the ACK. RFC 9147 says to sort ACKs numerically. It is unclear if
  // other implementations do this, but go ahead and sort for now. See
  // https://mailarchive.ietf.org/arch/msg/tls/kjJnquJOVaWxu5hUCmNzB35eqY0/.
  // Remove this if rfc9147bis removes this requirement.
  InplaceVector<DTLSRecordNumber, DTLS_MAX_ACK_BUFFER> sorted;
  for (size_t i = ssl->d1->records_to_ack.size() - num_acks;
       i < ssl->d1->records_to_ack.size(); i++) {
    sorted.PushBack(ssl->d1->records_to_ack[i]);
  }
  std::sort(sorted.begin(), sorted.end());

  uint8_t buf[2 + 16 * DTLS_MAX_ACK_BUFFER];
  CBB cbb, child;
  CBB_init_fixed(&cbb, buf, sizeof(buf));
  BSSL_CHECK(CBB_add_u16_length_prefixed(&cbb, &child));
  for (const auto &number : sorted) {
    BSSL_CHECK(CBB_add_u64(&child, number.epoch()));
    BSSL_CHECK(CBB_add_u64(&child, number.sequence()));
  }
  BSSL_CHECK(CBB_flush(&cbb));

  // Encrypt it.
  uint8_t record[DTLS1_3_RECORD_HEADER_WRITE_LENGTH + sizeof(buf) +
                 1 /* record type */ + EVP_AEAD_MAX_OVERHEAD];
  size_t record_len;
  DTLSRecordNumber record_number;
  if (!dtls_seal_record(ssl, &record_number, record, &record_len,
                        sizeof(record), SSL3_RT_ACK, CBB_data(&cbb),
                        CBB_len(&cbb), ssl->d1->write_epoch.epoch())) {
    return -1;
  }

  ssl_do_msg_callback(ssl, /*is_write=*/1, SSL3_RT_ACK,
                      Span(CBB_data(&cbb), CBB_len(&cbb)));

  int bio_ret =
      BIO_write(ssl->wbio.get(), record, static_cast<int>(record_len));
  if (bio_ret <= 0) {
    ssl->s3->rwstate = SSL_ERROR_WANT_WRITE;
    return bio_ret;
  }

  if (BIO_flush(ssl->wbio.get()) <= 0) {
    ssl->s3->rwstate = SSL_ERROR_WANT_WRITE;
    return -1;
  }

  return 1;
}